

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

uint8 * __thiscall
bloaty::Options::InternalSerializeWithCachedSizesToArray
          (Options *this,uint8 *target,EpsCopyOutputStream *stream)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  bool bVar2;
  uint uVar3;
  int32 iVar4;
  size_t sVar5;
  uint64 uVar6;
  string *psVar7;
  void *pvVar8;
  Options *pOVar9;
  Options *pOVar10;
  Type *pTVar11;
  Type *this_00;
  uint8 *puVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  uint8 *local_48;
  Options *local_40;
  uint local_34;
  
  iVar14 = (this->filename_).super_RepeatedPtrFieldBase.current_size_;
  iVar15 = 0;
  local_48 = target;
  local_40 = this;
  if (iVar14 < 1) {
    iVar14 = iVar15;
  }
  for (; puVar12 = local_48, iVar14 != iVar15; iVar15 = iVar15 + 1) {
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(this->filename_).super_RepeatedPtrFieldBase,iVar15);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((pTVar11->_M_dataplus)._M_p,(int)pTVar11->_M_string_length,SERIALIZE,
               "bloaty.Options.filename");
    sVar5 = pTVar11->_M_string_length;
    if (((long)sVar5 < 0x80) && ((long)sVar5 <= (long)(stream->end_ + (0xe - (long)puVar12)))) {
      *puVar12 = '\n';
      puVar12[1] = (uint8)sVar5;
      memcpy(puVar12 + 2,(pTVar11->_M_dataplus)._M_p,sVar5);
      local_48 = puVar12 + sVar5 + 2;
    }
    else {
      local_48 = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,1,pTVar11,puVar12);
    }
  }
  iVar14 = (local_40->base_filename_).super_RepeatedPtrFieldBase.current_size_;
  iVar15 = 0;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  pRVar1 = &local_40->base_filename_;
  for (; puVar12 = local_48, iVar14 != iVar15; iVar15 = iVar15 + 1) {
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&pRVar1->super_RepeatedPtrFieldBase,iVar15);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((pTVar11->_M_dataplus)._M_p,(int)pTVar11->_M_string_length,SERIALIZE,
               "bloaty.Options.base_filename");
    sVar5 = pTVar11->_M_string_length;
    if (((long)sVar5 < 0x80) && ((long)sVar5 <= (long)(stream->end_ + (0xe - (long)puVar12)))) {
      *puVar12 = '\x12';
      puVar12[1] = (uint8)sVar5;
      memcpy(puVar12 + 2,(pTVar11->_M_dataplus)._M_p,sVar5);
      local_48 = puVar12 + sVar5 + 2;
    }
    else {
      local_48 = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,2,pTVar11,puVar12);
    }
  }
  iVar14 = (local_40->data_source_).super_RepeatedPtrFieldBase.current_size_;
  iVar15 = 0;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  pRVar1 = &local_40->data_source_;
  for (; pOVar9 = local_40, puVar12 = local_48, iVar14 != iVar15; iVar15 = iVar15 + 1) {
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&pRVar1->super_RepeatedPtrFieldBase,iVar15);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((pTVar11->_M_dataplus)._M_p,(int)pTVar11->_M_string_length,SERIALIZE,
               "bloaty.Options.data_source");
    sVar5 = pTVar11->_M_string_length;
    if (((long)sVar5 < 0x80) && ((long)sVar5 <= (long)(stream->end_ + (0xe - (long)puVar12)))) {
      *puVar12 = '\x1a';
      puVar12[1] = (uint8)sVar5;
      memcpy(puVar12 + 2,(pTVar11->_M_dataplus)._M_p,sVar5);
      local_48 = puVar12 + sVar5 + 2;
    }
    else {
      local_48 = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,3,pTVar11,puVar12);
    }
  }
  uVar3 = (local_40->_has_bits_).has_bits_[0];
  if ((uVar3 >> 8 & 1) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    uVar6 = pOVar9->max_rows_per_level_;
    *local_48 = ' ';
    local_48 = google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uVar6,local_48 + 1);
  }
  if ((uVar3 & 4) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    iVar4 = pOVar9->demangle_;
    *local_48 = '(';
    local_48 = google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                         (iVar4,local_48 + 1);
  }
  if ((uVar3 & 8) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    iVar4 = pOVar9->sort_by_;
    *local_48 = '0';
    local_48 = google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                         (iVar4,local_48 + 1);
  }
  local_34 = uVar3;
  if ((uVar3 & 0x10) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    iVar4 = pOVar9->verbose_level_;
    *local_48 = '8';
    local_48 = google::protobuf::io::CodedOutputStream::WriteVarint32SignExtendedToArray
                         (iVar4,local_48 + 1);
  }
  iVar14 = (pOVar9->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar15 = 0; pOVar10 = local_40, iVar14 != iVar15; iVar15 = iVar15 + 1) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
                        (&(pOVar9->custom_data_source_).super_RepeatedPtrFieldBase,iVar15);
    *local_48 = 'B';
    puVar12 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                        ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_48 + 1);
    local_48 = CustomDataSource::InternalSerializeWithCachedSizesToArray(this_00,puVar12,stream);
  }
  if ((local_34 & 1) != 0) {
    psVar7 = (local_40->disassemble_function_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar7->_M_dataplus)._M_p,(int)psVar7->_M_string_length,SERIALIZE,
               "bloaty.Options.disassemble_function");
    local_48 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,9,(pOVar10->disassemble_function_).ptr_,local_48);
  }
  iVar14 = (pOVar10->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
  iVar15 = 0;
  if (iVar14 < 1) {
    iVar14 = iVar15;
  }
  for (; uVar3 = local_34, pOVar9 = local_40, iVar14 != iVar15; iVar15 = iVar15 + 1) {
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(pOVar10->debug_filename_).super_RepeatedPtrFieldBase,iVar15);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((pTVar11->_M_dataplus)._M_p,(int)pTVar11->_M_string_length,SERIALIZE,
               "bloaty.Options.debug_filename");
    puVar12 = local_48;
    sVar5 = pTVar11->_M_string_length;
    if (((long)sVar5 < 0x80) && ((long)sVar5 <= (long)(stream->end_ + (0xe - (long)local_48)))) {
      *local_48 = 'R';
      local_48[1] = (uint8)sVar5;
      memcpy(local_48 + 2,(pTVar11->_M_dataplus)._M_p,sVar5);
      local_48 = puVar12 + sVar5 + 2;
    }
    else {
      local_48 = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,10,pTVar11,local_48);
    }
  }
  cVar13 = (char)local_34;
  if ((local_34 & 0x40) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    uVar6 = pOVar9->debug_vmaddr_;
    *local_48 = 'X';
    local_48 = google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uVar6,local_48 + 1);
  }
  if (cVar13 < '\0') {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    uVar6 = pOVar9->debug_fileoff_;
    *local_48 = '`';
    local_48 = google::protobuf::io::CodedOutputStream::WriteVarint64ToArray(uVar6,local_48 + 1);
  }
  if ((uVar3 & 2) != 0) {
    psVar7 = (pOVar9->source_filter_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar7->_M_dataplus)._M_p,(int)psVar7->_M_string_length,SERIALIZE,
               "bloaty.Options.source_filter");
    local_48 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0xd,(pOVar9->source_filter_).ptr_,local_48);
  }
  if ((uVar3 & 0x20) != 0) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_48);
    bVar2 = pOVar9->dump_raw_map_;
    *local_48 = 'p';
    local_48 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                         ((uint)bVar2,local_48 + 1);
  }
  iVar14 = (pOVar9->source_map_).super_RepeatedPtrFieldBase.current_size_;
  iVar15 = 0;
  if (iVar14 < 1) {
    iVar14 = iVar15;
  }
  for (; iVar14 != iVar15; iVar15 = iVar15 + 1) {
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(pOVar9->source_map_).super_RepeatedPtrFieldBase,iVar15);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((pTVar11->_M_dataplus)._M_p,(int)pTVar11->_M_string_length,SERIALIZE,
               "bloaty.Options.source_map");
    puVar12 = local_48;
    sVar5 = pTVar11->_M_string_length;
    if (((long)sVar5 < 0x80) && ((long)sVar5 <= (long)(stream->end_ + (0xe - (long)local_48)))) {
      *local_48 = 'z';
      local_48[1] = (uint8)sVar5;
      memcpy(local_48 + 2,(pTVar11->_M_dataplus)._M_p,sVar5);
      local_48 = puVar12 + sVar5 + 2;
    }
    else {
      local_48 = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,0xf,pTVar11,local_48);
    }
  }
  pvVar8 = (local_40->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar8 & 1) != 0) {
    local_48 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar8 & 0xfffffffffffffffe),local_48,stream);
  }
  return local_48;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Options::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.Options)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string filename = 1;
  for (int i = 0, n = this->_internal_filename_size(); i < n; i++) {
    const auto& s = this->_internal_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.filename");
    target = stream->WriteString(1, s, target);
  }

  // repeated string base_filename = 2;
  for (int i = 0, n = this->_internal_base_filename_size(); i < n; i++) {
    const auto& s = this->_internal_base_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.base_filename");
    target = stream->WriteString(2, s, target);
  }

  // repeated string data_source = 3;
  for (int i = 0, n = this->_internal_data_source_size(); i < n; i++) {
    const auto& s = this->_internal_data_source(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.data_source");
    target = stream->WriteString(3, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional int64 max_rows_per_level = 4 [default = 20];
  if (cached_has_bits & 0x00000100u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(4, this->_internal_max_rows_per_level(), target);
  }

  // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      5, this->_internal_demangle(), target);
  }

  // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      6, this->_internal_sort_by(), target);
  }

  // optional int32 verbose_level = 7;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(7, this->_internal_verbose_level(), target);
  }

  // repeated .bloaty.CustomDataSource custom_data_source = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_custom_data_source_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(8, this->_internal_custom_data_source(i), target, stream);
  }

  // optional string disassemble_function = 9;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_disassemble_function().data(), static_cast<int>(this->_internal_disassemble_function().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.disassemble_function");
    target = stream->WriteStringMaybeAliased(
        9, this->_internal_disassemble_function(), target);
  }

  // repeated string debug_filename = 10;
  for (int i = 0, n = this->_internal_debug_filename_size(); i < n; i++) {
    const auto& s = this->_internal_debug_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.debug_filename");
    target = stream->WriteString(10, s, target);
  }

  // optional uint64 debug_vmaddr = 11;
  if (cached_has_bits & 0x00000040u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(11, this->_internal_debug_vmaddr(), target);
  }

  // optional uint64 debug_fileoff = 12;
  if (cached_has_bits & 0x00000080u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(12, this->_internal_debug_fileoff(), target);
  }

  // optional string source_filter = 13;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_filter().data(), static_cast<int>(this->_internal_source_filter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.source_filter");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_source_filter(), target);
  }

  // optional bool dump_raw_map = 14;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_dump_raw_map(), target);
  }

  // repeated string source_map = 15;
  for (int i = 0, n = this->_internal_source_map_size(); i < n; i++) {
    const auto& s = this->_internal_source_map(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.source_map");
    target = stream->WriteString(15, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.Options)
  return target;
}